

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogProgram.cpp
# Opt level: O1

string * __thiscall
DatalogProgram::toString_abi_cxx11_(string *__return_storage_ptr__,DatalogProgram *this)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Schemes","");
  pred_list_str(__return_storage_ptr__,this,&local_f0,&this->schemes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Facts","");
  pred_list_str(&local_50,this,&local_d0,&this->facts);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pcVar3 = "Rules";
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Rules","");
  lheader(&local_50,(DatalogProgram *)pcVar3,&local_b0,
          (int)((ulong)((long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      Rule::toString_abi_cxx11_
                (&local_50,
                 (this->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4]);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar1 = uVar5 < (ulong)((long)(this->rules).
                                    super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this->rules).
                                    super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Queries","");
  pred_list_str(&local_50,this,&local_90,&this->queries);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar3 = "Domain";
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Domain","");
  lheader(&local_50,(DatalogProgram *)pcVar3,&local_70,
          (int)(this->domain)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  for (p_Var2 = (this->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->domain)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var2 + 1));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string DatalogProgram::toString()
{
  string res = pred_list_str("Schemes", schemes);
  res += pred_list_str("Facts", facts);
  res += lheader((string)"Rules", rules.size());

  for (unsigned int i = 0; i < rules.size(); i++) {
    res += "  ";
    res += rules[i]->toString();
    res += "\n";
  }

  res += pred_list_str("Queries", queries);

  res += lheader("Domain", domain.size());
  set<string>::iterator it;
  for (it = domain.begin(); it != domain.end(); ++it)
  {
    res += "  ";
    res += *it;
    res += "\n";
  }
  return res;
}